

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_226::GlobalTypeOptimization::run(GlobalTypeOptimization *this,Module *module)

{
  __node_base_ptr *this_00;
  Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  *this_01;
  __node_base_ptr *this_02;
  __node_base_ptr *pp_Var1;
  pointer puVar2;
  Global *pGVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Hash_node_base *p_Var6;
  HeapType HVar7;
  bool bVar8;
  uint uVar9;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *pSVar10;
  FieldInfo *pFVar11;
  __node_type *p_Var12;
  __node_base_ptr p_Var13;
  Struct *pSVar14;
  StructValues<wasm::(anonymous_namespace)::FieldInfo> *this_03;
  mapped_type *this_04;
  pointer pFVar15;
  mapped_type *this_05;
  size_type sVar16;
  undefined **ppuVar17;
  ulong uVar18;
  int iVar19;
  ulong index;
  pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
  *ppVar20;
  long lVar21;
  size_t *psVar22;
  undefined8 *puVar23;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar24;
  _Hash_node_base *p_Var25;
  pointer pFVar26;
  ulong uVar27;
  long *plVar28;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  size_type *psVar29;
  size_type __new_size;
  reference rVar30;
  undefined1 local_440 [8];
  FieldInfoScanner scanner;
  undefined1 local_2b8 [8];
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionNewInfos;
  FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> functionSetGetInfos;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> propagator;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> removableIndexes;
  undefined1 local_e8 [8];
  StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> subSupers;
  type subs;
  HeapType local_48;
  HeapType type;
  uint local_34;
  
  if (((module->features).features & 0x400) == 0) {
    return;
  }
  type.id = (uintptr_t)module;
  if ((((this->super_Pass).runner)->options).closedWorld == false) {
    Fatal::Fatal((Fatal *)local_440);
    Fatal::operator<<((Fatal *)local_440,(char (*) [28])"GTO requires --closed-world");
    Fatal::~Fatal((Fatal *)local_440);
  }
  StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
  FunctionStructValuesMap
            ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_2b8,module);
  this_00 = &functionNewInfos.
             super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_single_bucket;
  StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::
  FunctionStructValuesMap
            ((FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_00,module);
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.runner =
       (PassRunner *)
       &scanner.
        super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
        .
        super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
        .super_Pass.name._M_string_length;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.name._M_string_length._0_1_ = 0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .super_Pass.name.field_2._8_8_ = 0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .replacep = (Expression **)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currFunction = (Function *)0x0;
  ppuVar17 = &PTR__WalkerPass_00e1ea28;
  local_440 = (undefined1  [8])&PTR__WalkerPass_00e1ea28;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currModule = (Module *)local_2b8;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .functionNewInfos = (FunctionStructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)this_00;
  Pass::setPassRunner((Pass *)local_440,(this->super_Pass).runner);
  (**(_func_int **)((long)local_440 + 0x10))((Pass *)local_440,module);
  this_01 = (Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
             *)(&scanner.
                 super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
                 .
                 super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                 .super_Pass.name.field_2._M_allocated_capacity + 1);
  Pass::setPassRunner((Pass *)local_440,(this->super_Pass).runner);
  puVar2 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currFunction = (Function *)module;
  for (puVar24 = (module->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar2; puVar24 = puVar24 + 1
      ) {
    pGVar3 = (puVar24->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if ((pGVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk(this_01,&pGVar3->init);
    }
  }
  plVar4 = *(long **)(type.id + 0x68);
  for (plVar28 = *(long **)(type.id + 0x60); plVar28 != plVar4; plVar28 = plVar28 + 1) {
    lVar21 = *plVar28;
    if (*(long *)(lVar21 + 0x28) != 0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk(this_01,(Expression **)(lVar21 + 0x28));
      lVar21 = *plVar28;
    }
    puVar5 = *(undefined8 **)(lVar21 + 0x40);
    for (puVar23 = *(undefined8 **)(lVar21 + 0x38); puVar23 != puVar5; puVar23 = puVar23 + 1) {
      propagator.subTypes.typeSubTypes._M_h._M_single_bucket = (__node_base_ptr)*puVar23;
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk(this_01,(Expression **)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
  }
  plVar4 = *(long **)(type.id + 0x98);
  for (plVar28 = *(long **)(type.id + 0x90); plVar28 != plVar4; plVar28 = plVar28 + 1) {
    if (*(long *)(*plVar28 + 0x30) != 0) {
      Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
      ::walk(this_01,(Expression **)(*plVar28 + 0x30));
    }
  }
  scanner.
  super_StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  .
  super_PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .
  super_Walker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
  .currFunction = (Function *)0x0;
  psVar29 = &functionSetGetInfos.
             super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_bucket_count;
  while (psVar29 = (size_type *)*psVar29, psVar29 != (size_type *)0x0) {
    psVar22 = psVar29 + 4;
    while (psVar22 = (size_t *)*psVar22, psVar22 != (size_t *)0x0) {
      for (uVar9 = 0; uVar18 = (ulong)uVar9, uVar18 < (ulong)((long)(psVar22[3] - psVar22[2]) >> 1);
          uVar9 = uVar9 + 1) {
        pSVar10 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (&this->combinedSetGetInfos,(HeapType)psVar22[1]);
        pFVar11 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (pSVar10,uVar18);
        ppuVar17 = (undefined **)psVar22[2];
        if ((ulong)((long)(psVar22[3] - (long)ppuVar17) >> 1) <= uVar18) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                        ,0x27,
                        "const T &wasm::StructUtils::StructValues<wasm::(anonymous namespace)::FieldInfo>::operator[](size_t) const [T = wasm::(anonymous namespace)::FieldInfo]"
                       );
        }
        FieldInfo::combine(pFVar11,(FieldInfo *)
                                   ((long)&(((__node_type *)ppuVar17)->super__Hash_node_base)._M_nxt
                                   + uVar18 * 2));
      }
    }
  }
  SubTypes::SubTypes((SubTypes *)
                     &functionSetGetInfos.
                      super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                      ._M_h._M_single_bucket,(Module *)type.id);
  local_e8 = (undefined1  [8])0x0;
  ppVar20 = (pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
             *)(this->combinedSetGetInfos).
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               ._M_h._M_bucket_count;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 0;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_element_count;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count =
       *(size_type *)
        &(this->combinedSetGetInfos).
         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
         ._M_h._M_rehash_policy;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets = (__buckets_ptr)ppVar20;
  local_e8 = (undefined1  [8])
             std::
             _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_allocate_buckets
                       ((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_e8,(size_type)ppVar20);
  p_Var25 = (this->combinedSetGetInfos).
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_before_begin._M_nxt;
  if (p_Var25 != (_Hash_node_base *)0x0) {
    subSupers.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_bucket_count =
         (size_type)
         std::__detail::
         _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
         ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                       *)(p_Var25 + 1),ppVar20);
    ppVar20 = (pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>
               *)&subSupers.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_bucket_count;
    p_Var6 = p_Var25[5]._M_nxt;
    (((__node_type *)
     subSupers.
     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
     ._M_h._M_bucket_count)->
    super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var6;
    ((_Hash_node_base *)
    ((long)local_e8 +
    ((ulong)p_Var6 %
    (ulong)subSupers.
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           ._M_h._M_buckets) * 8))->_M_nxt = (_Hash_node_base *)ppVar20;
    p_Var12 = (__node_type *)
              subSupers.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_bucket_count;
    while (ppuVar17 = (undefined **)p_Var12, p_Var25 = p_Var25->_M_nxt,
          p_Var25 != (_Hash_node_base *)0x0) {
      p_Var12 = std::__detail::
                _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                ::operator()((_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>>,true>>>
                              *)(p_Var25 + 1),ppVar20);
      (((__node_type *)ppuVar17)->super__Hash_node_base)._M_nxt = &p_Var12->super__Hash_node_base;
      p_Var6 = p_Var25[5]._M_nxt;
      (p_Var12->
      super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
      ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var6;
      uVar18 = (ulong)p_Var6 %
               (ulong)subSupers.
                      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                      ._M_h._M_buckets;
      if (((_Hash_node_base *)((long)local_e8 + uVar18 * 8))->_M_nxt == (__node_base_ptr)0x0) {
        ((_Hash_node_base *)((long)local_e8 + uVar18 * 8))->_M_nxt = (_Hash_node_base *)ppuVar17;
      }
    }
  }
  StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
            ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
             &functionSetGetInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,
             (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_e8,true,
             SUB81(ppuVar17,0));
  subSupers.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket =
       (__node_base_ptr)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_buckets;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets =
       (__buckets_ptr)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_bucket_count;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count =
       (size_type)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_before_begin._M_nxt;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_element_count;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count =
       *(size_type *)
        &(this->combinedSetGetInfos).
         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
         ._M_h._M_rehash_policy;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._0_8_ =
       (this->combinedSetGetInfos).
       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
       ._M_h._M_rehash_policy._M_next_resize;
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  pp_Var1 = &(this->combinedSetGetInfos).
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_single_bucket;
  if ((__node_base_ptr)pp_Var1 ==
      subSupers.
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_single_bucket) {
    subSupers.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_single_bucket =
         (__node_base_ptr)
         &subs.
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
          ._M_h._M_rehash_policy._M_next_resize;
    subs.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_rehash_policy._M_next_resize = (size_t)*pp_Var1;
  }
  if ((_Hash_node_base *)
      subs.
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      ._M_h._M_bucket_count != (_Hash_node_base *)0x0) {
    ((size_t *)
    subSupers.
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    ._M_h._M_single_bucket)
    [(ulong)((_Hash_node_base *)
            (subs.
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             ._M_h._M_bucket_count + 0x28))->_M_nxt %
     (ulong)subs.
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            ._M_h._M_buckets] =
         (size_t)&subs.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  ._M_h._M_bucket_count;
  }
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_bucket_count = 1;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_buckets = pp_Var1;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->combinedSetGetInfos).
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_element_count = 0;
  StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo>::propagate
            ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::FieldInfo> *)
             &functionSetGetInfos.
              super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,
             (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
             &subSupers.
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              ._M_h._M_single_bucket,false,
             SUB81(subSupers.
                   super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                   ._M_h._M_single_bucket,0));
  subs.
  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)&this->canBecomeImmutable;
  for (p_Var13 = functionSetGetInfos.
                 super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                 ._M_h._M_single_bucket;
      p_Var13 !=
      (__node_base_ptr)
      propagator.subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
      _M_impl.super__Vector_impl_data._M_start; p_Var13 = p_Var13 + 1) {
    local_48.id = (uintptr_t)p_Var13->_M_nxt;
    bVar8 = HeapType::isStruct(&local_48);
    if (bVar8) {
      pSVar14 = HeapType::getStruct(&local_48);
      pSVar10 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                          ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)local_e8,
                           local_48);
      this_03 = StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                          ((StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *)
                           &subSupers.
                            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                            ._M_h._M_single_bucket,local_48);
      __new_size = 1;
      while( true ) {
        uVar18 = (ulong)((int)__new_size - 1);
        pFVar15 = (pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar26 = (pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)pFVar26 - (long)pFVar15 >> 4) <= uVar18) break;
        if ((pFVar15[uVar18].mutable_ != Immutable) &&
           (pFVar11 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                                (pSVar10,uVar18), pFVar11->hasWrite == false)) {
          this_04 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<bool,_std::allocator<bool>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)subs.
                                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                                    ._M_h._M_single_bucket,&local_48);
          std::vector<bool,_std::allocator<bool>_>::resize(this_04,__new_size,false);
          rVar30 = std::vector<bool,_std::allocator<bool>_>::operator[](this_04,uVar18);
          *rVar30._M_p = *rVar30._M_p | rVar30._M_mask;
        }
        __new_size = (size_type)((int)__new_size + 1);
      }
      removableIndexes._M_t._M_impl._0_8_ = removableIndexes._M_t._M_impl._0_8_ & 0xffffffff00000000
      ;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&removableIndexes;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_34 = 0;
      removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      while( true ) {
        uVar27 = (long)pFVar26 - (long)pFVar15 >> 4;
        uVar18 = uVar27;
        if (uVar27 <= local_34) break;
        pFVar11 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (pSVar10,(ulong)local_34);
        if (pFVar11->hasRead == false) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,&local_34);
        }
        local_34 = local_34 + 1;
        pFVar15 = (pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar26 = (pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      while( true ) {
        if ((int)uVar27 < 1) break;
        index = uVar18 - 1 & 0xffffffff;
        pFVar11 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                            (this_03,index);
        if ((pFVar11->hasRead != false) ||
           (pFVar11 = StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>::operator[]
                                (this_03,index), pFVar11->hasWrite != false)) break;
        local_34 = (int)uVar27 - 1;
        uVar27 = (ulong)local_34;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>
                  ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,&local_34);
        uVar18 = uVar18 - 1;
      }
      if (removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0)
      {
        this_05 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->indexesAfterRemovals,&local_48);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (this_05,(long)(pSVar14->fields).
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pSVar14->fields).
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 4);
        iVar19 = 0;
        for (local_34 = 0;
            (ulong)local_34 <
            (ulong)((long)(pSVar14->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pSVar14->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start >> 4); local_34 = local_34 + 1) {
          sVar16 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,&local_34);
          if (sVar16 == 0) {
            (this_05->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[local_34] = local_34 - iVar19;
          }
          else {
            (this_05->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[local_34] = 0xffffffff;
            iVar19 = iVar19 + 1;
          }
        }
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    }
  }
  if ((this->indexesAfterRemovals)._M_h._M_element_count == 0) {
    if ((this->canBecomeImmutable)._M_h._M_element_count == 0) goto LAB_008532f8;
  }
  else {
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         &removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    removableIndexes._M_t._M_impl._0_8_ = 0;
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)removableIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    removableIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
         (__node_base_ptr)&PTR__WalkerPass_00e1ea80;
    this_02 = &propagator.subTypes.typeSubTypes._M_h._M_single_bucket;
    Pass::setPassRunner((Pass *)this_02,(this->super_Pass).runner);
    HVar7 = type;
    (*(code *)propagator.subTypes.typeSubTypes._M_h._M_single_bucket[2]._M_nxt)(this_02,type.id);
    psVar22 = &removableIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count;
    Pass::setPassRunner((Pass *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                        (this->super_Pass).runner);
    plVar4 = *(long **)(HVar7.id + 0x38);
    for (plVar28 = *(long **)(HVar7.id + 0x30); plVar28 != plVar4; plVar28 = plVar28 + 1) {
      if (*(long *)(*plVar28 + 0x20) == 0) {
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)psVar22,
                   (Expression **)(*plVar28 + 0x40));
      }
    }
    plVar4 = *(long **)(type.id + 0x68);
    for (plVar28 = *(long **)(type.id + 0x60); plVar28 != plVar4; plVar28 = plVar28 + 1) {
      lVar21 = *plVar28;
      if (*(long *)(lVar21 + 0x28) != 0) {
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)psVar22,
                   (Expression **)(lVar21 + 0x28));
        lVar21 = *plVar28;
      }
      puVar5 = *(undefined8 **)(lVar21 + 0x40);
      for (puVar23 = *(undefined8 **)(lVar21 + 0x38); puVar23 != puVar5; puVar23 = puVar23 + 1) {
        local_48.id = *puVar23;
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)psVar22,
                   (Expression **)&local_48);
      }
    }
    plVar4 = *(long **)(type.id + 0x98);
    for (plVar28 = *(long **)(type.id + 0x90); plVar28 != plVar4; plVar28 = plVar28 + 1) {
      if (*(long *)(*plVar28 + 0x30) != 0) {
        Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::walk
                  ((Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_> *)psVar22,
                   (Expression **)(*plVar28 + 0x30));
      }
    }
    WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>::~WalkerPass
              ((WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    if ((this->canBecomeImmutable)._M_h._M_element_count == 0 &&
        (this->indexesAfterRemovals)._M_h._M_element_count == 0) goto LAB_008532f8;
  }
  GlobalTypeRewriter::GlobalTypeRewriter
            ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
             (Module *)type.id);
  propagator.subTypes.typeSubTypes._M_h._M_single_bucket =
       (__node_base_ptr)&PTR__GlobalTypeRewriter_00e1ead8;
  GlobalTypeRewriter::update
            ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
  GlobalTypeRewriter::~GlobalTypeRewriter
            ((GlobalTypeRewriter *)&propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
LAB_008532f8:
  std::
  unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)&subSupers.
                       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                       ._M_h._M_single_bucket);
  std::
  unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)local_e8);
  SubTypes::~SubTypes((SubTypes *)
                      &functionSetGetInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                       ._M_h._M_single_bucket);
  WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
  ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::(anonymous_namespace)::FieldInfo,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                 *)local_440);
  std::
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)&functionNewInfos.
                       super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                       ._M_h._M_single_bucket);
  std::
  unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
  ::~unordered_map((unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                    *)local_2b8);
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "GTO requires --closed-world";
    }

    // Find and analyze struct operations inside each function.
    StructUtils::FunctionStructValuesMap<FieldInfo> functionNewInfos(*module),
      functionSetGetInfos(*module);
    FieldInfoScanner scanner(functionNewInfos, functionSetGetInfos);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Combine the data from the functions.
    functionSetGetInfos.combineInto(combinedSetGetInfos);
    // TODO: combine newInfos as well, once we have a need for that (we will
    //       when we do things like subtyping).

    // Propagate information to super and subtypes on set/get infos:
    //
    //  * For removing unread fields, we can only remove a field if it is never
    //    read in any sub or supertype, as such a read may alias any of those
    //    types (where the field is present).
    //
    //    Note that we *can* propagate reads only to supertypes, but we are
    //    limited in what we optimize. If type A has fields {a, b}, and its
    //    subtype B has the same fields, and if field a is only used in reads of
    //    type B, then we still cannot remove it. If we removed it then A would
    //    have fields {b}, that is, field b would be at index 0, while type B
    //    would still be {a, b} which has field b at index 1, which is not
    //    compatible. The only case in which we can optimize is to remove a
    //    field from the end, that is, we could remove field b from A.
    //    Otherwise, as mentioned before we can only remove a field if we also
    //    remove it from all sub- and super-types.
    //
    //  * For immutability, this is necessary because we cannot have a
    //    supertype's field be immutable while a subtype's is not - they must
    //    match for us to preserve subtyping.
    //
    //    Note that we do not need to care about types here: If the fields were
    //    mutable before, then they must have had identical types for them to be
    //    subtypes (as wasm only allows the type to differ if the fields are
    //    immutable). Note that by making more things immutable we therefore
    //    make it possible to apply more specific subtypes in subtype fields.
    StructUtils::TypeHierarchyPropagator<FieldInfo> propagator(*module);
    auto subSupers = combinedSetGetInfos;
    propagator.propagateToSuperAndSubTypes(subSupers);
    auto subs = std::move(combinedSetGetInfos);
    propagator.propagateToSubTypes(subs);

    // Process the propagated info.
    for (auto type : propagator.subTypes.types) {
      if (!type.isStruct()) {
        continue;
      }
      auto& fields = type.getStruct().fields;
      auto& subSuper = subSupers[type];
      auto& sub = subs[type];

      // Process immutability.
      for (Index i = 0; i < fields.size(); i++) {
        if (fields[i].mutable_ == Immutable) {
          // Already immutable; nothing to do.
          continue;
        }

        if (subSuper[i].hasWrite) {
          // A set exists.
          continue;
        }

        // No set exists. Mark it as something we can make immutable.
        auto& vec = canBecomeImmutable[type];
        vec.resize(i + 1);
        vec[i] = true;
      }

      // Process removability. We check separately for the ability to
      // remove in a general way based on sub+super-propagated info (that is,
      // fields that are not used in sub- or super-types, and so we can
      // definitely remove them from all the relevant types) and also in the
      // specific way that only works for removing at the end, which as
      // mentioned above only looks at super-types.
      std::set<Index> removableIndexes;
      for (Index i = 0; i < fields.size(); i++) {
        if (!subSuper[i].hasRead) {
          removableIndexes.insert(i);
        }
      }
      for (int i = int(fields.size()) - 1; i >= 0; i--) {
        // Unlike above, a write would stop us here: above we propagated to both
        // sub- and super-types, which means if we see no reads then there is no
        // possible read of the data at all. But here we just propagated to
        // subtypes, and so we need to care about the case where the parent
        // writes to a field but does not read from it - we still need those
        // writes to happen as children may read them. (Note that if no child
        // reads this field, and since we check for reads in parents here, that
        // means the field is not read anywhere at all, and we would have
        // handled that case in the previous loop anyhow.)
        if (!sub[i].hasRead && !sub[i].hasWrite) {
          removableIndexes.insert(i);
        } else {
          // Once we see something we can't remove, we must stop, as we can only
          // remove from the end in this case.
          break;
        }
      }
      if (!removableIndexes.empty()) {
        auto& indexesAfterRemoval = indexesAfterRemovals[type];
        indexesAfterRemoval.resize(fields.size());
        Index skip = 0;
        for (Index i = 0; i < fields.size(); i++) {
          if (!removableIndexes.count(i)) {
            indexesAfterRemoval[i] = i - skip;
          } else {
            indexesAfterRemoval[i] = RemovedField;
            skip++;
          }
        }
      }
    }

    // If we found fields that can be removed, remove them from instructions.
    // (Note that we must do this first, while we still have the old heap types
    // that we can identify, and only after this should we update all the types
    // throughout the module.)
    if (!indexesAfterRemovals.empty()) {
      removeFieldsInInstructions(*module);
    }

    // Update the types in the entire module.
    if (!indexesAfterRemovals.empty() || !canBecomeImmutable.empty()) {
      updateTypes(*module);
    }
  }